

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CaseGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseGenerateSyntax,slang::syntax::CaseGenerateSyntax_const&>
          (BumpAllocator *this,CaseGenerateSyntax *args)

{
  CaseGenerateSyntax *this_00;
  
  this_00 = (CaseGenerateSyntax *)allocate(this,0xd0,8);
  slang::syntax::CaseGenerateSyntax::CaseGenerateSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }